

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s.hpp
# Opt level: O0

void __thiscall
estl::vector_s<std::__cxx11::string,10ul>::shift_right<std::__cxx11::string*>
          (vector_s<std::__cxx11::string,10ul> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *first,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *last,size_type n)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *it;
  pointer insert_ptr;
  size_type i;
  long diff_signed;
  size_type n_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *last_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *first_local;
  vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
  *this_local;
  
  if (-1 < (long)last - (long)first >> 5) {
    for (insert_ptr = (pointer)0x0; local_48 = last, insert_ptr < n;
        insert_ptr = (pointer)&insert_ptr->field_0x1) {
      std::__cxx11::string::string((string *)(last + (long)insert_ptr));
    }
    while (local_48 != first) {
      local_48 = local_48 + -1;
      std::__cxx11::string::operator=((string *)(local_48 + n),(string *)local_48);
    }
  }
  return;
}

Assistant:

void shift_right(InputIt first, InputIt last, size_type n)
    {
        const long diff_signed = last - first;
        if (diff_signed < 0) {
            return;
        }

        // Make room for elements
        for (size_type i = 0; i < n; ++i) {
            const pointer insert_ptr = last + i;
            new (insert_ptr) value_type(); // Default contruct the extra elements needed. Could perhaps construct when first needed instead!
        }

        for (InputIt it = last; it != first;) {
            --it;
            *(it+n) = std::move(*it);
        }
    }